

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_test_class.cpp
# Opt level: O2

void __thiscall test_test::test_char_compare::test_method(test_char_compare *this)

{
  unit_test_log_t *puVar1;
  char rcca2 [6];
  char rca1 [6];
  char lcca2 [6];
  unit_test_log_t local_528;
  undefined1 local_520;
  undefined1 *local_518;
  char *local_510;
  char *rccpc4;
  char *rccp3;
  char lca1 [6];
  char *lccpc4;
  char *lccp3;
  char *local_4e0;
  char *local_4d8;
  const_string local_4d0;
  const_string local_4c0;
  char *local_4b0;
  char *local_4a8;
  const_string local_4a0;
  const_string local_490;
  char *local_480;
  char *local_478;
  const_string local_470;
  const_string local_460;
  char *local_450;
  char *local_448;
  const_string local_440;
  const_string local_430;
  char *local_420;
  char *local_418;
  const_string local_410;
  const_string local_400;
  char *local_3f0;
  char *local_3e8;
  const_string local_3e0;
  const_string local_3d0;
  char *local_3c0;
  char *local_3b8;
  const_string local_3b0;
  const_string local_3a0;
  char *local_390;
  char *local_388;
  const_string local_380;
  const_string local_370;
  char *local_360;
  char *local_358;
  const_string local_350;
  const_string local_340;
  char *local_330;
  char *local_328;
  const_string local_320;
  const_string local_310;
  char *local_300;
  char *local_2f8;
  const_string local_2f0;
  const_string local_2e0;
  char *local_2d0;
  char *local_2c8;
  const_string local_2c0;
  const_string local_2b0;
  char *local_2a0;
  char *local_298;
  const_string local_290;
  const_string local_280;
  char *local_270;
  char *local_268;
  const_string local_260;
  const_string local_250;
  char *local_240;
  char *local_238;
  const_string local_230;
  const_string local_220;
  char *local_210;
  char *local_208;
  const_string local_200;
  const_string local_1f0;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0;
  char *local_1b0;
  char *local_1a8;
  const_string local_1a0;
  const_string local_190;
  char *local_180;
  char *local_178;
  const_string local_170;
  const_string local_160;
  char *local_150;
  char *local_148;
  const_string local_140;
  const_string local_130;
  char *local_120;
  char *local_118;
  const_string local_110;
  const_string local_100;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  builtin_strncpy(lca1,"World",6);
  builtin_strncpy(rca1,"World",6);
  builtin_strncpy(lcca2,"World",6);
  builtin_strncpy(rcca2,"World",6);
  lccp3 = "World";
  rccp3 = "World";
  lccpc4 = "World";
  rccpc4 = "World";
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x1d,&local_50);
  puVar1 = &local_528;
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_60,0x1d,1,2,"World","\"World\"","World","\"World\"");
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_70,0x1e,&local_80);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_88 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_90,0x1e,1,2,"World","\"World\"",rca1,"rca1");
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a0,0x1f,&local_b0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_b8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_c0,0x1f,1,2,"World","\"World\"",rcca2,"rcca2");
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_d0,0x20,&local_e0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_e8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char_const*>
            (puVar1,&local_f0,0x20,1,2,"World","\"World\"",&rccp3,"rccp3");
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_100.m_end = "";
  local_110.m_begin = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_100,0x21,&local_110);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_118 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char_const*>
            (puVar1,&local_120,0x21,1,2,"World","\"World\"",&rccpc4,"rccpc4");
  local_130.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_130.m_end = "";
  local_140.m_begin = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_130,0x23,&local_140);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_148 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_150,0x23,1,2,lca1,"lca1","World","\"World\"");
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_160,0x24,&local_170);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_178 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_180,0x24,1,2,lca1,"lca1",rca1,"rca1");
  local_190.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_190.m_end = "";
  local_1a0.m_begin = "";
  local_1a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_190,0x25,&local_1a0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1a8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_1b0,0x25,1,2,lca1,"lca1",rcca2,"rcca2");
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1c0.m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1c0,0x26,&local_1d0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1d8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char_const*>
            (puVar1,&local_1e0,0x26,1,2,lca1,"lca1",&rccp3,"rccp3");
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_1f0.m_end = "";
  local_200.m_begin = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1f0,0x27,&local_200);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_208 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char_const*>
            (puVar1,&local_210,0x27,1,2,lca1,"lca1",&rccpc4,"rccpc4");
  local_220.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_220.m_end = "";
  local_230.m_begin = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_220,0x29,&local_230);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_238 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_240,0x29,1,2,lcca2,"lcca2","World","\"World\"");
  local_250.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_250.m_end = "";
  local_260.m_begin = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_250,0x2a,&local_260);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_268 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_270,0x2a,1,2,lcca2,"lcca2",rca1,"rca1");
  local_280.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_280.m_end = "";
  local_290.m_begin = "";
  local_290.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_280,0x2b,&local_290);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_298 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char[6]>
            (puVar1,&local_2a0,0x2b,1,2,lcca2,"lcca2",rcca2,"rcca2");
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2b0.m_end = "";
  local_2c0.m_begin = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2b0,0x2c,&local_2c0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2c8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char_const*>
            (puVar1,&local_2d0,0x2c,1,2,lcca2,"lcca2",&rccp3,"rccp3");
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2e0.m_end = "";
  local_2f0.m_begin = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2e0,0x2d,&local_2f0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_2f8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char[6],char_const*>
            (puVar1,&local_300,0x2d,1,2,lcca2,"lcca2",&rccpc4,"rccpc4");
  local_310.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_310.m_end = "";
  local_320.m_begin = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_310,0x2f,&local_320);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_328 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_330,0x2f,1,2,&lccp3,"lccp3","World","\"World\"");
  local_340.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_340.m_end = "";
  local_350.m_begin = "";
  local_350.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_340,0x30,&local_350);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_358 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_360,0x30,1,2,&lccp3,"lccp3",rca1,"rca1");
  local_370.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_370.m_end = "";
  local_380.m_begin = "";
  local_380.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_370,0x31,&local_380);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_388 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_390,0x31,1,2,&lccp3,"lccp3",rcca2,"rcca2");
  local_3a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3a0.m_end = "";
  local_3b0.m_begin = "";
  local_3b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3a0,0x32,&local_3b0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3b8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char_const*>
            (puVar1,&local_3c0,0x32,1,2,&lccp3,"lccp3",&rccp3,"rccp3");
  local_3d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3d0.m_end = "";
  local_3e0.m_begin = "";
  local_3e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3d0,0x33,&local_3e0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_3e8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char_const*>
            (puVar1,&local_3f0,0x33,1,2,&lccp3,"lccp3",&rccpc4,"rccpc4");
  local_400.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_400.m_end = "";
  local_410.m_begin = "";
  local_410.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_400,0x35,&local_410);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_418 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_420,0x35,1,2,&lccpc4,"lccpc4","World","\"World\"");
  local_430.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_430.m_end = "";
  local_440.m_begin = "";
  local_440.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_430,0x36,&local_440);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_448 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_450,0x36,1,2,&lccpc4,"lccpc4",rca1,"rca1");
  local_460.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_460.m_end = "";
  local_470.m_begin = "";
  local_470.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_460,0x37,&local_470);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_478 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_480,0x37,1,2,&lccpc4,"lccpc4",rcca2,"rcca2");
  local_490.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_490.m_end = "";
  local_4a0.m_begin = "";
  local_4a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_490,0x38,&local_4a0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_4a8 = "";
  puVar1 = &local_528;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char_const*>
            (puVar1,&local_4b0,0x38,1,2,&lccpc4,"lccpc4",&rccp3,"rccp3");
  local_4c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_4c0.m_end = "";
  local_4d0.m_begin = "";
  local_4d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_4c0,0x39,&local_4d0);
  local_520 = 0;
  local_528.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_00177ca0;
  local_518 = boost::unit_test::lazy_ostream::inst;
  local_510 = "";
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_test_class.cpp"
  ;
  local_4d8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char_const*>
            (&local_528,&local_4e0,0x39,1,2,&lccpc4,"lccpc4",&rccpc4,"rccpc4");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_char_compare)
{
    char lca1[] = "World";
    char rca1[] = "World";
    const char lcca2[] = "World", rcca2[] = "World";
    const char *lccp3 = "World";
    const char *rccp3 = "World";
    const char * const lccpc4 = "World";
    const char * const rccpc4 = "World";

    BOOST_CHECK_EQUAL("World", "World");
    BOOST_CHECK_EQUAL("World", rca1);
    BOOST_CHECK_EQUAL("World", rcca2);
    BOOST_CHECK_EQUAL("World", rccp3);
    BOOST_CHECK_EQUAL("World", rccpc4);

    BOOST_CHECK_EQUAL(lca1, "World");
    BOOST_CHECK_EQUAL(lca1, rca1);
    BOOST_CHECK_EQUAL(lca1, rcca2);
    BOOST_CHECK_EQUAL(lca1, rccp3);
    BOOST_CHECK_EQUAL(lca1, rccpc4);

    BOOST_CHECK_EQUAL(lcca2, "World");
    BOOST_CHECK_EQUAL(lcca2, rca1);
    BOOST_CHECK_EQUAL(lcca2, rcca2);
    BOOST_CHECK_EQUAL(lcca2, rccp3);
    BOOST_CHECK_EQUAL(lcca2, rccpc4);

    BOOST_CHECK_EQUAL(lccp3, "World");
    BOOST_CHECK_EQUAL(lccp3, rca1);
    BOOST_CHECK_EQUAL(lccp3, rcca2);
    BOOST_CHECK_EQUAL(lccp3, rccp3);
    BOOST_CHECK_EQUAL(lccp3, rccpc4);

    BOOST_CHECK_EQUAL(lccpc4, "World");
    BOOST_CHECK_EQUAL(lccpc4, rca1);
    BOOST_CHECK_EQUAL(lccpc4, rcca2);
    BOOST_CHECK_EQUAL(lccpc4, rccp3);
    BOOST_CHECK_EQUAL(lccpc4, rccpc4);
}